

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

int Ivy_FraigProve(Ivy_Man_t **ppManAig,void *pPars)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  double dVar7;
  double dVar8;
  ABC_INT64_T local_a0;
  ABC_INT64_T nSatInspects;
  ABC_INT64_T nSatConfs;
  abctime clk;
  int nIter;
  int RetValue;
  Ivy_Man_t *pManTemp;
  Ivy_Man_t *pManAig;
  Ivy_FraigParams_t *pIvyParams;
  Ivy_FraigParams_t Params;
  Prove_Params_t *pParams;
  void *pPars_local;
  Ivy_Man_t **ppManAig_local;
  
  pManAig = (Ivy_Man_t *)&pIvyParams;
  nSatInspects = 0;
  local_a0 = 0;
  pManTemp = *ppManAig;
  Params._56_8_ = pPars;
  Ivy_FraigParamsDefault((Ivy_FraigParams_t *)pManAig);
  (pManAig->Ghost).TravId = *(int *)(Params._56_8_ + 0xc);
  (pManAig->Ghost).Id = 1;
  if (*(int *)(Params._56_8_ + 0xc) != 0) {
    pcVar6 = "no";
    if (*(int *)(Params._56_8_ + 4) != 0) {
      pcVar6 = "yes";
    }
    pcVar5 = "no";
    if (*(int *)Params._56_8_ != 0) {
      pcVar5 = "yes";
    }
    printf("RESOURCE LIMITS: Iterations = %d. Rewriting = %s. Fraiging = %s.\n",
           (ulong)*(uint *)(Params._56_8_ + 0x10),pcVar6,pcVar5);
    printf("Miter = %d (%3.1f).  Rwr = %d (%3.1f).  Fraig = %d (%3.1f).  Last = %d.\n",
           (double)*(float *)(Params._56_8_ + 0x18),(double)*(float *)(Params._56_8_ + 0x20),
           (double)*(float *)(Params._56_8_ + 0x28),(ulong)*(uint *)(Params._56_8_ + 0x14),
           (ulong)*(uint *)(Params._56_8_ + 0x1c),(ulong)*(uint *)(Params._56_8_ + 0x24),
           (ulong)*(uint *)(Params._56_8_ + 0x34));
  }
  if ((*(int *)(Params._56_8_ + 4) == 0) && (*(int *)Params._56_8_ == 0)) {
    nSatConfs = Abc_Clock();
    iVar2 = *(int *)(Params._56_8_ + 0x34);
    iVar1 = Ivy_ManPoNum(pManTemp);
    *(int *)&(pManAig->Ghost).pFanin0 = iVar2 / iVar1;
    _nIter = pManTemp;
    pManTemp = Ivy_FraigMiter(pManTemp,(Ivy_FraigParams_t *)pManAig);
    Ivy_ManStop(_nIter);
    clk._4_4_ = Ivy_FraigMiterStatus(pManTemp);
    Ivy_FraigMiterPrint(pManTemp,"SAT solving",nSatConfs,*(int *)(Params._56_8_ + 0xc));
    *ppManAig = pManTemp;
    ppManAig_local._4_4_ = clk._4_4_;
  }
  else {
    iVar2 = Ivy_ManNodeNum(pManTemp);
    if (iVar2 < 500) {
      nSatConfs = Abc_Clock();
      iVar2 = *(int *)(Params._56_8_ + 0x14);
      iVar1 = Ivy_ManPoNum(pManTemp);
      *(int *)&(pManAig->Ghost).pFanin0 = iVar2 / iVar1;
      _nIter = pManTemp;
      pManTemp = Ivy_FraigMiter(pManTemp,(Ivy_FraigParams_t *)pManAig);
      Ivy_ManStop(_nIter);
      clk._4_4_ = Ivy_FraigMiterStatus(pManTemp);
      Ivy_FraigMiterPrint(pManTemp,"SAT solving",nSatConfs,*(int *)(Params._56_8_ + 0xc));
      if (-1 < clk._4_4_) {
        *ppManAig = pManTemp;
        return clk._4_4_;
      }
    }
    clk._4_4_ = -1;
    for (clk._0_4_ = 0; (int)clk < *(int *)(Params._56_8_ + 0x10); clk._0_4_ = (int)clk + 1) {
      if (*(int *)(Params._56_8_ + 0xc) != 0) {
        uVar3 = (int)clk + 1;
        iVar2 = *(int *)(Params._56_8_ + 0x14);
        dVar7 = pow((double)*(float *)(Params._56_8_ + 0x18),(double)(int)clk);
        iVar1 = *(int *)(Params._56_8_ + 0x24);
        dVar8 = pow((double)*(float *)(Params._56_8_ + 0x28),(double)(int)clk);
        printf("ITERATION %2d : Confs = %6d. FraigBTL = %3d. \n",(ulong)uVar3,
               (ulong)(uint)(int)((double)iVar2 * dVar7),(ulong)(uint)(int)((double)iVar1 * dVar8));
        fflush(_stdout);
      }
      if ((-1 < clk._4_4_) || (clk._4_4_ = Ivy_FraigMiterStatus(pManTemp), -1 < clk._4_4_)) break;
      if (*(int *)Params._56_8_ != 0) {
        nSatConfs = Abc_Clock();
        iVar2 = *(int *)(Params._56_8_ + 0x24);
        dVar7 = pow((double)*(float *)(Params._56_8_ + 0x28),(double)(int)clk);
        (pManAig->Ghost).nRefs = (int)((double)iVar2 * dVar7);
        iVar2 = *(int *)(Params._56_8_ + 0x14);
        dVar7 = pow((double)*(float *)(Params._56_8_ + 0x18),(double)(int)clk);
        iVar1 = Ivy_ManPoNum(pManTemp);
        *(int *)&(pManAig->Ghost).pFanin0 = (int)((double)iVar2 * dVar7) / iVar1 + 1;
        _nIter = pManTemp;
        pManTemp = Ivy_FraigPerform_int
                             (pManTemp,(Ivy_FraigParams_t *)pManAig,
                              *(ABC_INT64_T *)(Params._56_8_ + 0x38),
                              *(ABC_INT64_T *)(Params._56_8_ + 0x40),&nSatInspects,&local_a0);
        Ivy_ManStop(_nIter);
        clk._4_4_ = Ivy_FraigMiterStatus(pManTemp);
        Ivy_FraigMiterPrint(pManTemp,"Fraiging   ",nSatConfs,*(int *)(Params._56_8_ + 0xc));
      }
      if (-1 < clk._4_4_) break;
      *(ABC_INT64_T *)(Params._56_8_ + 0x48) = nSatInspects + *(long *)(Params._56_8_ + 0x48);
      *(ABC_INT64_T *)(Params._56_8_ + 0x50) = local_a0 + *(long *)(Params._56_8_ + 0x50);
      if (((*(long *)(Params._56_8_ + 0x38) != 0) &&
          (*(long *)(Params._56_8_ + 0x38) <= *(long *)(Params._56_8_ + 0x48))) ||
         ((*(long *)(Params._56_8_ + 0x40) != 0 &&
          (*(long *)(Params._56_8_ + 0x40) <= *(long *)(Params._56_8_ + 0x50))))) {
        printf("Reached global limit on conflicts/inspects. Quitting.\n");
        *ppManAig = pManTemp;
        return -1;
      }
    }
    if ((clk._4_4_ == 0) && (pManTemp->pData == (void *)0x0)) {
      iVar2 = Ivy_ManPiNum(pManTemp);
      pvVar4 = malloc((long)iVar2 << 2);
      pManTemp->pData = pvVar4;
      pvVar4 = pManTemp->pData;
      iVar2 = Ivy_ManPiNum(pManTemp);
      memset(pvVar4,0,(long)iVar2 << 2);
    }
    *ppManAig = pManTemp;
    ppManAig_local._4_4_ = clk._4_4_;
  }
  return ppManAig_local._4_4_;
}

Assistant:

int Ivy_FraigProve( Ivy_Man_t ** ppManAig, void * pPars )
{
    Prove_Params_t * pParams = (Prove_Params_t *)pPars;
    Ivy_FraigParams_t Params, * pIvyParams = &Params; 
    Ivy_Man_t * pManAig, * pManTemp;
    int RetValue, nIter;
    abctime clk;//, Counter;
    ABC_INT64_T nSatConfs = 0, nSatInspects = 0;

    // start the network and parameters
    pManAig = *ppManAig;
    Ivy_FraigParamsDefault( pIvyParams );
    pIvyParams->fVerbose = pParams->fVerbose;
    pIvyParams->fProve = 1;

    if ( pParams->fVerbose )
    {
        printf( "RESOURCE LIMITS: Iterations = %d. Rewriting = %s. Fraiging = %s.\n",
            pParams->nItersMax, pParams->fUseRewriting? "yes":"no", pParams->fUseFraiging? "yes":"no" );
        printf( "Miter = %d (%3.1f).  Rwr = %d (%3.1f).  Fraig = %d (%3.1f).  Last = %d.\n", 
            pParams->nMiteringLimitStart,  pParams->nMiteringLimitMulti, 
            pParams->nRewritingLimitStart, pParams->nRewritingLimitMulti,
            pParams->nFraigingLimitStart,  pParams->nFraigingLimitMulti, pParams->nMiteringLimitLast );
    }

    // if SAT only, solve without iteration
    if ( !pParams->fUseRewriting && !pParams->fUseFraiging )
    {
        clk = Abc_Clock();
        pIvyParams->nBTLimitMiter = pParams->nMiteringLimitLast / Ivy_ManPoNum(pManAig);
        pManAig = Ivy_FraigMiter( pManTemp = pManAig, pIvyParams );  Ivy_ManStop( pManTemp );
        RetValue = Ivy_FraigMiterStatus( pManAig );
        Ivy_FraigMiterPrint( pManAig, "SAT solving", clk, pParams->fVerbose );
        *ppManAig = pManAig;
        return RetValue;
    }

    if ( Ivy_ManNodeNum(pManAig) < 500 )
    {
        // run the first mitering
        clk = Abc_Clock();
        pIvyParams->nBTLimitMiter = pParams->nMiteringLimitStart / Ivy_ManPoNum(pManAig);
        pManAig = Ivy_FraigMiter( pManTemp = pManAig, pIvyParams );  Ivy_ManStop( pManTemp );
        RetValue = Ivy_FraigMiterStatus( pManAig );
        Ivy_FraigMiterPrint( pManAig, "SAT solving", clk, pParams->fVerbose );
        if ( RetValue >= 0 )
        {
            *ppManAig = pManAig;
            return RetValue;
        }
    }

    // check the current resource limits
    RetValue = -1;
    for ( nIter = 0; nIter < pParams->nItersMax; nIter++ )
    {
        if ( pParams->fVerbose )
        {
            printf( "ITERATION %2d : Confs = %6d. FraigBTL = %3d. \n", nIter+1, 
                 (int)(pParams->nMiteringLimitStart * pow(pParams->nMiteringLimitMulti,nIter)), 
                 (int)(pParams->nFraigingLimitStart * pow(pParams->nFraigingLimitMulti,nIter)) );
            fflush( stdout );
        }

        // try rewriting
        if ( pParams->fUseRewriting )
        { // bug in Ivy_NodeFindCutsAll() when leaves are identical!
/*
            clk = Abc_Clock();
            Counter = (int)(pParams->nRewritingLimitStart * pow(pParams->nRewritingLimitMulti,nIter));
            pManAig = Ivy_ManRwsat( pManAig, 0 );  
            RetValue = Ivy_FraigMiterStatus( pManAig );
            Ivy_FraigMiterPrint( pManAig, "Rewriting  ", clk, pParams->fVerbose );
*/
        }
        if ( RetValue >= 0 )
            break;

        // catch the situation when ref pattern detects the bug
        RetValue = Ivy_FraigMiterStatus( pManAig );
        if ( RetValue >= 0 )
            break;

        // try fraiging followed by mitering
        if ( pParams->fUseFraiging )
        {
            clk = Abc_Clock();
            pIvyParams->nBTLimitNode  = (int)(pParams->nFraigingLimitStart * pow(pParams->nFraigingLimitMulti,nIter));
            pIvyParams->nBTLimitMiter = 1 + (int)(pParams->nMiteringLimitStart * pow(pParams->nMiteringLimitMulti,nIter)) / Ivy_ManPoNum(pManAig);
            pManAig = Ivy_FraigPerform_int( pManTemp = pManAig, pIvyParams, pParams->nTotalBacktrackLimit, pParams->nTotalInspectLimit, &nSatConfs, &nSatInspects );  Ivy_ManStop( pManTemp );
            RetValue = Ivy_FraigMiterStatus( pManAig );
            Ivy_FraigMiterPrint( pManAig, "Fraiging   ", clk, pParams->fVerbose );
        }
        if ( RetValue >= 0 )
            break;

        // add to the number of backtracks and inspects
        pParams->nTotalBacktracksMade += nSatConfs;
        pParams->nTotalInspectsMade   += nSatInspects;
        // check if global resource limit is reached
        if ( (pParams->nTotalBacktrackLimit && pParams->nTotalBacktracksMade >= pParams->nTotalBacktrackLimit) ||
             (pParams->nTotalInspectLimit   && pParams->nTotalInspectsMade   >= pParams->nTotalInspectLimit) )
        {
            printf( "Reached global limit on conflicts/inspects. Quitting.\n" );
            *ppManAig = pManAig;
            return -1;
        }
    }    
/*
    if ( RetValue < 0 )
    {
        if ( pParams->fVerbose )
        {
            printf( "Attempting SAT with conflict limit %d ...\n", pParams->nMiteringLimitLast );
            fflush( stdout );
        }
        clk = Abc_Clock();
        pIvyParams->nBTLimitMiter = pParams->nMiteringLimitLast / Ivy_ManPoNum(pManAig);
        if ( pParams->nTotalBacktrackLimit )
            s_nBTLimitGlobal  = pParams->nTotalBacktrackLimit - pParams->nTotalBacktracksMade;
        if ( pParams->nTotalInspectLimit )
            s_nInsLimitGlobal = pParams->nTotalInspectLimit -   pParams->nTotalInspectsMade;        
        pManAig = Ivy_FraigMiter( pManTemp = pManAig, pIvyParams );  Ivy_ManStop( pManTemp );
        s_nBTLimitGlobal  = 0;
        s_nInsLimitGlobal = 0;        
        RetValue = Ivy_FraigMiterStatus( pManAig );
        Ivy_FraigMiterPrint( pManAig, "SAT solving", clk, pParams->fVerbose );
        // make sure that the sover never returns "undecided" when infinite resource limits are set
        if( RetValue == -1 && pParams->nTotalInspectLimit == 0 &&
            pParams->nTotalBacktrackLimit == 0 )
        {
            extern void Prove_ParamsPrint( Prove_Params_t * pParams );
            Prove_ParamsPrint( pParams );
            printf("ERROR: ABC has returned \"undecided\" in spite of no limits...\n");
            exit(1);
        }
    }
*/
    // assign the model if it was proved by rewriting (const 1 miter)
    if ( RetValue == 0 && pManAig->pData == NULL )
    {
        pManAig->pData = ABC_ALLOC( int, Ivy_ManPiNum(pManAig) );
        memset( pManAig->pData, 0, sizeof(int) * Ivy_ManPiNum(pManAig) );
    }
    *ppManAig = pManAig;
    return RetValue;
}